

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locutil.cpp
# Opt level: O2

UBool icu_63::LocaleUtility::isFallbackOf(UnicodeString *root,UnicodeString *child)

{
  short sVar1;
  char16_t cVar2;
  int32_t iVar3;
  int iVar4;
  int offset;
  bool bVar5;
  
  iVar3 = UnicodeString::indexOf(child,root);
  if (iVar3 == 0) {
    sVar1 = (child->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar4 = (child->fUnion).fFields.fLength;
    }
    else {
      iVar4 = (int)sVar1 >> 5;
    }
    sVar1 = (root->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      offset = (root->fUnion).fFields.fLength;
    }
    else {
      offset = (int)sVar1 >> 5;
    }
    bVar5 = true;
    if (iVar4 != offset) {
      cVar2 = UnicodeString::doCharAt(child,offset);
      bVar5 = cVar2 == L'_';
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

UBool
LocaleUtility::isFallbackOf(const UnicodeString& root, const UnicodeString& child)
{
    return child.indexOf(root) == 0 &&
      (child.length() == root.length() ||
       child.charAt(root.length()) == UNDERSCORE_CHAR);
}